

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

void __thiscall iDynTree::SensorsList::destructor(SensorsList *this)

{
  pointer pvVar1;
  long lVar2;
  long *plVar3;
  SensorsListPimpl *this_00;
  size_t sensor_index;
  ulong uVar4;
  int sensor_type;
  long lVar5;
  
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    uVar4 = 0;
    while( true ) {
      pvVar1 = (this->pimpl->allSensors).
               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[lVar5].
                        super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                        _M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[lVar5].
                                 super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                 ._M_impl + 8) - lVar2 >> 3) <= uVar4) break;
      plVar3 = *(long **)(lVar2 + uVar4 * 8);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      uVar4 = uVar4 + 1;
    }
  }
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize(&this->pimpl->allSensors,0);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize(&this->pimpl->sensorsNameToIndex,0);
  this_00 = this->pimpl;
  if (this_00 != (SensorsListPimpl *)0x0) {
    SensorsListPimpl::~SensorsListPimpl(this_00);
  }
  operator_delete(this_00,0x30);
  this->pimpl = (SensorsListPimpl *)0x0;
  return;
}

Assistant:

void SensorsList::destructor()
{
    for( int sensor_type = 0; sensor_type < NR_OF_SENSOR_TYPES; sensor_type++ )
    {
        for(size_t sensor_index = 0;
            sensor_index < this->pimpl->allSensors[sensor_type].size(); sensor_index++ )
        {
            delete this->pimpl->allSensors[sensor_type][sensor_index];
        }
    }
    this->pimpl->allSensors.resize(0);
    this->pimpl->sensorsNameToIndex.resize(0);

    delete this->pimpl;
    this->pimpl = 0;
}